

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  uchar *puVar1;
  ushort *puVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uchar *puVar21;
  uchar *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong wpos;
  uint local_98;
  uint local_6c;
  uchar *puVar22;
  
  uVar25 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar25 = windowsize;
  }
  uVar11 = 0x40;
  if (0x1fff < windowsize) {
    uVar11 = 0x102;
  }
  if (windowsize - 0x8001 < 0xffff8000) {
    uVar25 = 0x3c;
  }
  else {
    uVar7 = windowsize - 1;
    if ((windowsize & uVar7) == 0) {
      uVar12 = 0x102;
      if (nicematch < 0x102) {
        uVar12 = nicematch;
      }
      uVar26 = 0;
      bVar4 = false;
      uVar6 = 0;
      local_6c = 0;
      for (; inpos < insize; inpos = inpos + 1) {
        uVar8 = getHash(in,insize,inpos);
        local_98 = 0;
        uVar14 = 0;
        if (uVar8 == 0) {
          if (uVar26 == 0) {
            uVar26 = countZeros(in,insize,inpos);
            uVar14 = (ulong)uVar26;
          }
          else {
            if ((insize < uVar26 + inpos) || (in[(uVar26 + inpos) - 1] != '\0')) {
              uVar26 = uVar26 - 1;
            }
            uVar14 = (ulong)uVar26;
          }
        }
        uVar26 = (uint)uVar14;
        wpos = (ulong)((uint)inpos & uVar7);
        updateHashChain(hash,wpos,uVar8,(unsigned_short)uVar14);
        uVar13 = inpos + 0x102;
        if (insize <= inpos + 0x102) {
          uVar13 = insize;
        }
        puVar1 = in + inpos;
        uVar24 = 0;
        uVar20 = 0;
        uVar15 = 0;
        uVar16 = (ulong)hash->chain[wpos];
        do {
          while( true ) {
            if (uVar15 == uVar25) goto LAB_0010dbdd;
            uVar18 = 0;
            if (wpos < uVar16) {
              uVar18 = (ulong)windowsize;
            }
            uVar18 = (wpos - uVar16) + uVar18;
            uVar17 = (uint)uVar18;
            if (uVar17 < (uint)uVar20) goto LAB_0010dbdd;
            if (uVar18 != 0) {
              puVar23 = in + (inpos - (uVar18 & 0xffffffff));
              puVar21 = puVar1;
              if (2 < uVar26) {
                uVar20 = (ulong)(uint)hash->zeros[uVar16];
                if (uVar26 < hash->zeros[uVar16]) {
                  uVar20 = uVar14;
                }
                puVar23 = puVar23 + uVar20;
                puVar21 = puVar1 + uVar20;
              }
              for (; (puVar22 = in + uVar13, puVar21 != in + uVar13 &&
                     (puVar22 = puVar21, *puVar23 == *puVar21)); puVar23 = puVar23 + 1) {
                puVar21 = puVar21 + 1;
              }
              uVar19 = (int)puVar22 - (int)puVar1;
              if ((uVar24 < uVar19) && (uVar24 = uVar19, local_98 = uVar17, uVar12 <= uVar19))
              goto LAB_0010dbdd;
            }
            uVar3 = hash->chain[uVar16];
            if ((ushort)uVar16 == uVar3) goto LAB_0010dbdd;
            uVar15 = uVar15 + 1;
            if ((2 < uVar26) && (uVar26 < uVar24)) break;
            uVar20 = uVar18 & 0xffffffff;
            uVar16 = (ulong)uVar3;
            if (hash->val[uVar3] != uVar8) goto LAB_0010dbdd;
          }
          puVar2 = hash->chainz + uVar16;
          uVar20 = uVar18 & 0xffffffff;
          uVar16 = (ulong)*puVar2;
        } while (uVar26 == hash->zeros[*puVar2]);
LAB_0010dbdd:
        bVar5 = bVar4;
        if (lazymatching == 0) {
LAB_0010dca0:
          if ((2 < uVar24) && (windowsize < local_98)) {
            return 0x56;
          }
          bVar4 = bVar5;
          if (((uVar24 < 3) || (uVar24 < minmatch)) || ((uVar24 == 3 && (0x1000 < local_98)))) {
            uVar8 = uivector_push_back(out,(uint)in[inpos]);
            if (uVar8 == 0) {
              return 0x53;
            }
          }
          else {
            sVar9 = searchCodeIndex(LENGTHBASE,0x1d,(ulong)uVar24);
            uVar26 = LENGTHBASE[sVar9 & 0xffffffff];
            sVar10 = searchCodeIndex(DISTANCEBASE,0x1e,(ulong)local_98);
            uVar8 = DISTANCEBASE[sVar10 & 0xffffffff];
            uivector_push_back(out,(int)sVar9 + 0x101);
            uivector_push_back(out,uVar24 - uVar26);
            uivector_push_back(out,(uint)sVar10);
            uivector_push_back(out,local_98 - uVar8);
            while( true ) {
              uVar24 = uVar24 - 1;
              sVar9 = inpos + 1;
              uVar26 = (uint)uVar14;
              if (uVar24 == 0) break;
              uVar15 = getHash(in,insize,sVar9);
              uVar8 = 0;
              if (uVar15 == 0) {
                if (uVar26 == 0) {
                  uVar8 = countZeros(in,insize,sVar9);
                }
                else if ((insize < sVar9 + uVar14) || (uVar8 = uVar26, in[inpos + uVar14] != '\0'))
                {
                  uVar8 = uVar26 - 1;
                }
              }
              updateHashChain(hash,(ulong)((uint)sVar9 & uVar7),uVar15,(unsigned_short)uVar8);
              uVar14 = (ulong)uVar8;
              inpos = sVar9;
            }
          }
        }
        else {
          if ((bVar4) || (uVar24 < 3)) {
            bVar5 = false;
            if (bVar4) {
              if (inpos == 0) {
                return 0x51;
              }
              if (uVar6 + 1 < uVar24) {
                uVar8 = uivector_push_back(out,(uint)in[inpos - 1]);
                bVar5 = false;
                if (uVar8 == 0) {
                  return 0x53;
                }
              }
              else {
                hash->head[uVar8] = -1;
                hash->headz[uVar14] = -1;
                inpos = inpos - 1;
                local_98 = local_6c;
                uVar24 = uVar6;
              }
            }
            goto LAB_0010dca0;
          }
          bVar5 = false;
          if (uVar11 < uVar24 || 0x101 < uVar24) goto LAB_0010dca0;
          local_6c = local_98;
          bVar4 = true;
          uVar6 = uVar24;
        }
      }
      uVar25 = 0;
    }
    else {
      uVar25 = 0x5a;
    }
  }
  return uVar25;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}